

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O2

void amrex::readIntData<long,int>(long *data,size_t size,istream *is,IntDescriptor *id)

{
  Ordering OVar1;
  Ordering OVar2;
  int iVar3;
  undefined8 in_RAX;
  IntDescriptor *this;
  size_t j;
  size_t sVar4;
  undefined4 uStack_38;
  int value;
  
  _uStack_38 = in_RAX;
  OVar1 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar2 = IntDescriptor::order(this);
  for (sVar4 = 0; size != sVar4; sVar4 = sVar4 + 1) {
    std::istream::read((char *)is,(long)&value);
    iVar3 = value;
    if (OVar1 != OVar2) {
      iVar3 = swapBytes(value);
      _uStack_38 = CONCAT44(iVar3,uStack_38);
    }
    data[sVar4] = (long)iVar3;
  }
  return;
}

Assistant:

void readIntData (To* data, std::size_t size, std::istream& is,
                      const amrex::IntDescriptor& id)
    {
        From value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            is.read((char*) &value, sizeof(From));
            if (swapEndian) value = swapBytes(value);
            data[j] = static_cast<To>(value);
        }
    }